

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

ClockingSkewSyntax * __thiscall slang::parsing::Parser::parseClockingSkew(Parser *this)

{
  bool bVar1;
  SyntaxFactory *in_RDI;
  Token edge_00;
  TimingControlSyntax *delay;
  Token edge;
  undefined1 in_stack_000002c7;
  Parser *in_stack_000002c8;
  TimingControlSyntax *in_stack_ffffffffffffffb8;
  TokenKind in_stack_ffffffffffffffce;
  Parser *in_stack_ffffffffffffffd0;
  undefined8 local_28;
  undefined8 local_8;
  
  edge_00 = parseEdgeKeyword(in_stack_ffffffffffffffd0);
  local_28 = (TimingControlSyntax *)0x0;
  bVar1 = ParserBase::peek(&in_stack_ffffffffffffffd0->super_ParserBase,in_stack_ffffffffffffffce);
  if (bVar1) {
    local_28 = parseTimingControl(in_stack_000002c8,(bool)in_stack_000002c7);
  }
  bVar1 = Token::operator_cast_to_bool((Token *)0xa510cb);
  if ((bVar1) || (local_28 != (TimingControlSyntax *)0x0)) {
    local_8 = slang::syntax::SyntaxFactory::clockingSkew(in_RDI,edge_00,in_stack_ffffffffffffffb8);
  }
  else {
    local_8 = (ClockingSkewSyntax *)0x0;
  }
  return local_8;
}

Assistant:

ClockingSkewSyntax* Parser::parseClockingSkew() {
    Token edge = parseEdgeKeyword();

    TimingControlSyntax* delay = nullptr;
    if (peek(TokenKind::Hash))
        delay = parseTimingControl();

    if (!edge && !delay)
        return nullptr;

    return &factory.clockingSkew(edge, delay);
}